

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

void __thiscall
Rml::Element::AddToStackingContext
          (Element *this,Vector<StackingContextChild> *stacking_children,bool is_flex_item,
          bool is_non_dom_element)

{
  pointer *ppSVar1;
  bool bVar2;
  byte bVar3;
  iterator __position;
  code *pcVar4;
  byte bVar5;
  bool bVar6;
  long lVar7;
  pointer pSVar8;
  long lVar9;
  StackingContextChild *pSVar10;
  RenderOrder RVar11;
  __normal_iterator<Rml::StackingContextChild_*,_std::vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>_>
  __seed;
  _Temporary_buffer<__gnu_cxx::__normal_iterator<Rml::StackingContextChild_*,_std::vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>_>,_Rml::StackingContextChild>
  local_48;
  
  if (this->visible != true) {
    return;
  }
  bVar2 = this->local_stacking_context;
  if (bVar2 == true) {
    RVar11 = StackPositive;
    if (this->z_index <= 0.0) {
      RVar11 = (uint)(0.0 <= this->z_index) * 9;
    }
    goto switchD_0021cfcf_default;
  }
  bVar3 = *(byte *)&(this->meta->computed_values).common;
  bVar5 = bVar3 & 0xf;
  switch(bVar5) {
  case 9:
    RVar11 = TableRow;
    break;
  case 10:
    RVar11 = TableRowGroup;
    break;
  case 0xb:
    RVar11 = TableColumn;
    break;
  case 0xc:
    RVar11 = TableColumnGroup;
    break;
  default:
    RVar11 = Positioned;
    bVar6 = true;
    if (((bVar3 & 0x30) != 0) || (RVar11 = Floating, 0x3f < bVar3)) goto LAB_0021ce91;
    RVar11 = Inline;
    switch(bVar5) {
    case 0:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
      bVar6 = Assert("RMLUI_ERROR",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                     ,0x978);
      if (!bVar6) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      goto switchD_0021cfcf_default;
    case 1:
    case 4:
    case 5:
    case 7:
      bVar6 = bVar5 == 7 || is_flex_item;
      RVar11 = Block;
      break;
    case 2:
    case 3:
    case 6:
    case 8:
      bVar6 = bVar5 != 2 || is_flex_item;
      break;
    case 0xd:
      RVar11 = TableCell;
      break;
    default:
      goto switchD_0021cfcf_default;
    }
    goto LAB_0021ce91;
  }
switchD_0021cfcf_default:
  bVar6 = false;
LAB_0021ce91:
  __position._M_current =
       (stacking_children->
       super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  local_48._M_original_len = (size_type_conflict)this;
  local_48._M_len._0_4_ = RVar11;
  if (__position._M_current ==
      (stacking_children->
      super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>::
    _M_realloc_insert<Rml::StackingContextChild>
              (stacking_children,__position,(StackingContextChild *)&local_48);
  }
  else {
    (__position._M_current)->element = this;
    *(ulong *)&(__position._M_current)->order = CONCAT44(local_48._M_len._4_4_,RVar11);
    ppSVar1 = &(stacking_children->
               super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
               )._M_impl.super__Vector_impl_data._M_finish;
    *ppSVar1 = *ppSVar1 + 1;
  }
  if ((bVar2 == false) &&
     ((this->children).
      super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->children).
      super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    lVar9 = (long)(stacking_children->
                  super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(stacking_children->
                  super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    AddChildrenToStackingContext(this,stacking_children);
    if (is_non_dom_element || bVar6) {
      pSVar8 = (stacking_children->
               super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pSVar10 = (stacking_children->
                super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      __seed._M_current = (StackingContextChild *)((long)pSVar8 + lVar9);
      if (__seed._M_current != pSVar10) {
        lVar7 = (long)pSVar10 - (long)__seed._M_current >> 4;
        ::std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<Rml::StackingContextChild_*,_std::vector<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>_>,_Rml::StackingContextChild>
        ::_Temporary_buffer(&local_48,__seed,(lVar7 - (lVar7 + 1 >> 0x3f)) + 1 >> 1);
        if (local_48._M_buffer == (pointer)0x0) {
          ::std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<Rml::StackingContextChild*,std::vector<Rml::StackingContextChild,std::allocator<Rml::StackingContextChild>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (__seed._M_current,pSVar10);
        }
        else {
          ::std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<Rml::StackingContextChild*,std::vector<Rml::StackingContextChild,std::allocator<Rml::StackingContextChild>>>,Rml::StackingContextChild*,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (__seed._M_current,pSVar10,local_48._M_buffer,
                     CONCAT44(local_48._M_len._4_4_,(RenderOrder)local_48._M_len));
        }
        operator_delete(local_48._M_buffer,
                        CONCAT44(local_48._M_len._4_4_,(RenderOrder)local_48._M_len) << 4);
        pSVar8 = (stacking_children->
                 super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        __seed._M_current =
             (stacking_children->
             super__Vector_base<Rml::StackingContextChild,_std::allocator<Rml::StackingContextChild>_>
             )._M_impl.super__Vector_impl_data._M_finish;
      }
      for (pSVar10 = pSVar8 + (lVar9 >> 4); pSVar10 != __seed._M_current; pSVar10 = pSVar10 + 1) {
        if ((StackPositive < pSVar10->order) || ((0x601U >> (pSVar10->order & 0x1f) & 1) == 0)) {
          pSVar10->order = RVar11;
        }
      }
    }
  }
  return;
}

Assistant:

void Element::AddToStackingContext(Vector<StackingContextChild>& stacking_children, bool is_flex_item, bool is_non_dom_element)
{
	using Style::Display;

	if (!IsVisible())
		return;

	const Display display = GetDisplay();

	RenderOrder order = RenderOrder::Inline;
	bool include_children = true;
	bool render_as_atomic_unit = false;

	if (local_stacking_context)
	{
		if (z_index > 0.f)
			order = RenderOrder::StackPositive;
		else if (z_index < 0.f)
			order = RenderOrder::StackNegative;
		else
			order = RenderOrder::Positioned;

		include_children = false;
	}
	else if (display == Display::TableRow || display == Display::TableRowGroup || display == Display::TableColumn ||
		display == Display::TableColumnGroup)
	{
		// Handle internal display values taking priority over position and float.
		switch (display)
		{
		case Display::TableRow: order = RenderOrder::TableRow; break;
		case Display::TableRowGroup: order = RenderOrder::TableRowGroup; break;
		case Display::TableColumn: order = RenderOrder::TableColumn; break;
		case Display::TableColumnGroup: order = RenderOrder::TableColumnGroup; break;
		default: break;
		}
	}
	else if (GetPosition() != Style::Position::Static)
	{
		order = RenderOrder::Positioned;
		render_as_atomic_unit = true;
	}
	else if (GetFloat() != Style::Float::None)
	{
		order = RenderOrder::Floating;
		render_as_atomic_unit = true;
	}
	else
	{
		switch (display)
		{
		case Display::Block:
		case Display::FlowRoot:
		case Display::Table:
		case Display::Flex:
			order = RenderOrder::Block;
			render_as_atomic_unit = (display == Display::Table || is_flex_item);
			break;

		case Display::Inline:
		case Display::InlineBlock:
		case Display::InlineFlex:
		case Display::InlineTable:
			order = RenderOrder::Inline;
			render_as_atomic_unit = (display != Display::Inline || is_flex_item);
			break;

		case Display::TableCell:
			order = RenderOrder::TableCell;
			render_as_atomic_unit = true;
			break;

		case Display::TableRow:
		case Display::TableRowGroup:
		case Display::TableColumn:
		case Display::TableColumnGroup:
		case Display::None: RMLUI_ERROR; break; // Handled above.
		}
	}

	if (is_non_dom_element)
		render_as_atomic_unit = true;

	stacking_children.push_back(StackingContextChild{this, order});

	if (include_children && !children.empty())
	{
		const size_t index_child_begin = stacking_children.size();

		AddChildrenToStackingContext(stacking_children);

		if (render_as_atomic_unit)
			StackingContext_MakeAtomicRange(stacking_children, index_child_begin, order);
	}
}